

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O1

void __thiscall
pfederc::Parser::parseClassConstructor
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes)

{
  size_t *psVar1;
  long *plVar2;
  size_t sVar3;
  Token *pTVar4;
  size_t sVar5;
  size_t sVar6;
  _List_node_base **pp_Var7;
  undefined8 uVar8;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *plVar9;
  _List_node_base *p_Var10;
  Lexer *pLVar11;
  pointer *__ptr;
  pointer __p;
  bool bVar12;
  initializer_list<pfederc::Position> __l;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  undefined1 local_a8 [16];
  vector<pfederc::Position,_std::allocator<pfederc::Position>_> local_98;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *local_80;
  Error<pfederc::SyntaxErrorCode> *local_78;
  Token *local_70;
  _Base_ptr local_68;
  Position local_48;
  
  local_70 = this->lexer->currentToken;
  Lexer::next(this->lexer);
  parseExpression((Parser *)local_a8,(Precedence)this);
  bVar12 = *(int *)&(((string *)(local_a8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12;
  if (bVar12) {
    local_80 = constructAttributes;
    do {
      plVar9 = local_80;
      uVar8 = local_a8._0_8_;
      if (*(_List_node_base **)local_a8._0_8_ != (_List_node_base *)&PTR__BiOpExpr_00128998) {
        __cxa_bad_cast();
      }
      if ((short)((string *)(local_a8._0_8_ + 0x38))->_M_string_length != 0x2e) {
        if (bVar12) {
          if (*(_List_node_base **)local_a8._0_8_ != (_List_node_base *)&PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          if ((short)((string *)(local_a8._0_8_ + 0x38))->_M_string_length == 0x53) {
            local_a8._0_8_ = (Lexer *)0x0;
            local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)(Lexer *)0x0;
            if (*(_List_node_base **)uVar8 == (_List_node_base *)&PTR__BiOpExpr_00128998) {
              local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)uVar8;
            }
            p_Var10 = (_List_node_base *)operator_new(0x18);
            p_Var10[1]._M_next =
                 (_List_node_base *)
                 local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            psVar1 = &(plVar9->
                      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                       &local_98);
            goto LAB_0010ff23;
          }
        }
        break;
      }
      if (*(_List_node_base **)local_a8._0_8_ != (_List_node_base *)&PTR__BiOpExpr_00128998) {
        __cxa_bad_cast();
      }
      plVar2 = *(long **)((long)&((string *)(local_a8._0_8_ + 0x38))->field_2 + 8);
      if ((int)plVar2[3] == 0x12) {
        if ((undefined **)*plVar2 != &PTR__BiOpExpr_00128998) {
          __cxa_bad_cast();
        }
        if ((short)plVar2[8] != 0x53) goto LAB_0010fdbb;
        local_68 = (_Base_ptr)
                   (local_80->
                   super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start =
             *(pointer *)((long)&((string *)(local_a8._0_8_ + 0x38))->field_2 + 8);
        *(undefined8 *)((long)&((string *)(local_a8._0_8_ + 0x38))->field_2 + 8) = 0;
        if ((local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
             _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
           ((_List_node_base *)
            (local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
             _M_impl.super__Vector_impl_data._M_start)->line !=
            (_List_node_base *)&PTR__BiOpExpr_00128998)) {
          local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
        }
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next =
             (_List_node_base *)
             local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar1 = &(local_80->
                  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   &local_98);
        pLVar11 = *(Lexer **)&((string *)(uVar8 + 0x38))->field_2;
        (((string *)(uVar8 + 0x38))->field_2)._M_allocated_capacity = 0;
      }
      else {
LAB_0010fdbb:
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
        sVar5 = plVar2[4];
        sVar6 = plVar2[5];
        sVar3 = plVar2[6];
        ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
        ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_VARDECL;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).line = sVar5;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).startIndex = sVar6;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->pos).endIndex = sVar3;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (((Error<pfederc::SyntaxErrorCode> *)
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start)->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        generateError((Parser *)&stack0xffffffffffffffb0,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   &stack0xffffffffffffffb0);
        if ((Error<pfederc::SyntaxErrorCode> *)
            local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
            _M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
                     (Error<pfederc::SyntaxErrorCode> *)
                     local_98.
                     super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        }
        pLVar11 = *(Lexer **)&((string *)(uVar8 + 0x38))->field_2;
        (((string *)(uVar8 + 0x38))->field_2)._M_allocated_capacity = 0;
      }
      if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
        pp_Var7 = (_List_node_base **)local_a8._0_8_;
        local_a8._0_8_ = pLVar11;
        (*(code *)(*pp_Var7)->_M_prev)();
        pLVar11 = (Lexer *)local_a8._0_8_;
      }
      local_a8._0_8_ = pLVar11;
      bVar12 = *(int *)&(((string *)(local_a8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12;
    } while (bVar12);
  }
  uVar8 = local_a8._0_8_;
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
  sVar5 = ((string *)(uVar8 + 0x18))->_M_string_length;
  sVar6 = (((string *)(uVar8 + 0x18))->field_2)._M_allocated_capacity;
  sVar3 = *(size_t *)((long)&((string *)(uVar8 + 0x18))->field_2 + 8);
  ((Error<pfederc::SyntaxErrorCode> *)
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
  ((Error<pfederc::SyntaxErrorCode> *)
  local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_VARDECL;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).line = sVar5;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).startIndex = sVar6;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->pos).endIndex = sVar3;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Error<pfederc::SyntaxErrorCode> *)
   local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
   super__Vector_impl_data._M_start)->extraPos).
  super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generateError((Parser *)&stack0xffffffffffffffa8,
                (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
             &stack0xffffffffffffffa8);
  if ((Error<pfederc::SyntaxErrorCode> *)
      local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
               (Error<pfederc::SyntaxErrorCode> *)
               local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
               _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0010ff23:
  bVar12 = expect(this,TOK_BRACKET_CLOSE);
  if (!bVar12) {
    pTVar4 = this->lexer->currentToken;
    local_48.line = (local_70->pos).line;
    local_48.startIndex = (local_70->pos).startIndex;
    local_48.endIndex = (local_70->pos).endIndex;
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              (&local_98,__l,(allocator_type *)(local_a8 + 0xf));
    local_78 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar5 = (pTVar4->pos).line;
    sVar6 = (pTVar4->pos).startIndex;
    sVar3 = (pTVar4->pos).endIndex;
    local_78->logLevel = LVL_ERROR;
    local_78->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
    (local_78->pos).line = sVar5;
    (local_78->pos).startIndex = sVar6;
    (local_78->pos).endIndex = sVar3;
    (local_78->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_78->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_78->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)&stack0xffffffffffffffa0,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffa0);
    if (local_78 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_78,local_78);
    }
    local_78 = (Error<pfederc::SyntaxErrorCode> *)0x0;
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_98.super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      operator_delete(local_98.
                      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((Lexer *)local_a8._0_8_ != (Lexer *)0x0) {
    (*(code *)(*(_List_node_base **)local_a8._0_8_)->_M_prev)();
  }
  return;
}

Assistant:

void Parser::parseClassConstructor(bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &constructAttributes) noexcept {
  const Token *const constructStart = lexer.getCurrentToken();
  lexer.next();

  std::unique_ptr<Expr> expr(parseExpression());
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    if (!isBiOpExpr(biopexpr.getRight(), TokenType::TOK_OP_DCL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, biopexpr.getRight().getPosition()));
      // advance to next left expression
      expr = biopexpr.getLeftPtr();
      continue;
    }

    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(biopexpr.getRightPtr().release())));
    // advance to next left expression
    expr = biopexpr.getLeftPtr();
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, expr->getPosition()));
    // soft error
  } else {
    constructAttributes.insert(constructAttributes.begin(),
      std::unique_ptr<BiOpExpr>(
        dynamic_cast<BiOpExpr*>(expr.release())));
  }

  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition(),
      std::vector<Position>{ constructStart->getPosition() }));
  }
}